

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

int ecx_readstate(ecx_contextt *context)

{
  ec_slavet *peVar1;
  ushort uVar2;
  ulong in_RAX;
  ushort uVar3;
  ushort uVar4;
  ec_alstatust slstat;
  undefined8 uStack_38;
  
  context->slavelist->ALstatuscode = 0;
  if (*context->slavecount < 1) {
    uVar2 = 0xff;
  }
  else {
    uVar4 = 1;
    uVar3 = 0xff;
    uStack_38 = in_RAX;
    do {
      uStack_38._0_4_ = (uint)(ushort)uStack_38;
      uStack_38 = uStack_38 & 0xffffffffffff;
      ecx_FPRD(context->port,context->slavelist[uVar4].configadr,0x130,6,
               (void *)((long)&uStack_38 + 2),6000);
      peVar1 = context->slavelist;
      peVar1[uVar4].ALstatuscode = uStack_38._6_2_;
      uVar2 = uStack_38._2_2_;
      if (uVar3 <= uStack_38._2_2_) {
        uVar2 = uVar3;
      }
      peVar1[uVar4].state = uStack_38._2_2_;
      peVar1->ALstatuscode = peVar1->ALstatuscode | uStack_38._6_2_;
      uVar4 = uVar4 + 1;
      uVar3 = uVar2;
    } while ((int)(uint)uVar4 <= *context->slavecount);
  }
  context->slavelist->state = uVar2;
  return (int)uVar2;
}

Assistant:

int ecx_readstate(ecx_contextt *context)
{
   uint16 slave, configadr, lowest, rval;
   ec_alstatust slstat;

   lowest = 0xff;
   context->slavelist[0].ALstatuscode = 0;
   for (slave = 1; slave <= *(context->slavecount); slave++)
   {
      configadr = context->slavelist[slave].configadr;
      slstat.alstatus = 0;
      slstat.alstatuscode = 0;
      ecx_FPRD(context->port, configadr, ECT_REG_ALSTAT, sizeof(slstat), &slstat, EC_TIMEOUTRET3);
      rval = etohs(slstat.alstatus);
      context->slavelist[slave].ALstatuscode = etohs(slstat.alstatuscode);
      if (rval < lowest)
      {
         lowest = rval;
      }
      context->slavelist[slave].state = rval;
      context->slavelist[0].ALstatuscode |= context->slavelist[slave].ALstatuscode;
   }
   context->slavelist[0].state = lowest;

   return lowest;
}